

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O1

void __thiscall
soul::ArrayWithPreallocation<soul::Structure_*,_8UL>::reserve
          (ArrayWithPreallocation<soul::Structure_*,_8UL> *this,size_t minSize)

{
  ulong uVar1;
  size_t sVar2;
  Structure **ppSVar3;
  Structure **ppSVar4;
  size_t sVar5;
  ulong uVar6;
  
  uVar1 = this->numAllocated;
  if (uVar1 < minSize) {
    uVar6 = minSize + 0xf & 0xfffffffffffffff0;
    if (uVar6 != 0) {
      ppSVar4 = (Structure **)operator_new__(uVar6 * 8);
      sVar2 = this->numActive;
      if (sVar2 != 0) {
        ppSVar3 = this->items;
        sVar5 = 0;
        do {
          ppSVar4[sVar5] = ppSVar3[sVar5];
          sVar5 = sVar5 + 1;
        } while (sVar2 != sVar5);
      }
      if (8 < uVar1) {
        if (this->items != (Structure **)0x0) {
          operator_delete__(this->items);
        }
        this->items = (Structure **)this->space;
        this->numAllocated = 8;
      }
      this->items = ppSVar4;
    }
    this->numAllocated = uVar6;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }